

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.hpp
# Opt level: O1

void __thiscall Centaurus::Stream::~Stream(Stream *this)

{
  pointer pwVar1;
  
  this->_vptr_Stream = (_func_int **)&PTR__Stream_001c0608;
  pwVar1 = (this->m_str)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)pwVar1 != &(this->m_str).field_2) {
    operator_delete(pwVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

void skip_multiline_comment()
    {
        wchar_t ch = get();
        for (; ch != L'\0'; ch = get())
        {
            if (ch == L'*')
            {
                ch = peek();
                if (ch == L'/')
                {
                    get();
                    return;
                }
            }
        }
        throw unexpected(EOF);
    }